

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_3e8f::test_from_range(void **param_1)

{
  _Bool _Var1;
  roaring64_bitmap_t *prVar2;
  uint64_t uVar3;
  
  prVar2 = roaring64_bitmap_from_range(0,1000000,200000);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_contains(prVar2,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x9a);
  _Var1 = roaring64_bitmap_contains(prVar2,200000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 200000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x9b);
  _Var1 = roaring64_bitmap_contains(prVar2,400000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 400000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x9c);
  _Var1 = roaring64_bitmap_contains(prVar2,600000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 600000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x9d);
  _Var1 = roaring64_bitmap_contains(prVar2,800000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 800000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x9e);
  _Var1 = roaring64_bitmap_contains(prVar2,1000000);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r, 1000000)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0x9f);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_from_range(0,100,0x14);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_contains(prVar2,0);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xa6);
  _Var1 = roaring64_bitmap_contains(prVar2,0x14);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 20)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xa7);
  _Var1 = roaring64_bitmap_contains(prVar2,0x28);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 40)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xa8);
  _Var1 = roaring64_bitmap_contains(prVar2,0x3c);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 60)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xa9);
  _Var1 = roaring64_bitmap_contains(prVar2,0x50);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, 80)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xaa);
  _Var1 = roaring64_bitmap_contains(prVar2,100);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r, 100)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xab);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_from_range(0xffff,0x10005,2);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_contains(prVar2,0xffff);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 16) - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb3);
  _Var1 = roaring64_bitmap_contains(prVar2,0x10001);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 16) + 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb4);
  _Var1 = roaring64_bitmap_contains(prVar2,0x10003);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 16) + 3)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb5);
  _Var1 = roaring64_bitmap_contains(prVar2,0x10005);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r, (1 << 16) + 5)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xb6);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_from_range(0xffff,0x20002,1);
  assert_r64_valid((roaring64_bitmap_t *)prVar2);
  _Var1 = roaring64_bitmap_contains(prVar2,0xffff);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 16) - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xbe);
  _Var1 = roaring64_bitmap_contains(prVar2,0x10000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 16) + 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xbf);
  _Var1 = roaring64_bitmap_contains(prVar2,0x10001);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 16) + 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xc0);
  _Var1 = roaring64_bitmap_contains(prVar2,0x1ffff);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 17) - 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xc1);
  _Var1 = roaring64_bitmap_contains(prVar2,0x20000);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 17) + 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xc2);
  _Var1 = roaring64_bitmap_contains(prVar2,0x20001);
  _assert_true((ulong)_Var1,"roaring64_bitmap_contains(r, (1 << 17) + 1)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xc3);
  _Var1 = roaring64_bitmap_contains(prVar2,0x20002);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r, (1 << 17) + 2)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xc4);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_from_range(0xfffffffffffefff5,0xffffffffffff0009,2);
  uVar3 = roaring64_bitmap_get_cardinality(prVar2);
  _assert_int_equal(uVar3,10,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0xcb);
  uVar3 = roaring64_bitmap_minimum(prVar2);
  _assert_int_equal(uVar3,0xfffffffffffefff5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0xcd);
  uVar3 = roaring64_bitmap_maximum(prVar2);
  _assert_int_equal(uVar3,0xffffffffffff0007,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0xce);
  roaring64_bitmap_free(prVar2);
  prVar2 = roaring64_bitmap_from_range(0xfffffffffffffffa,0xffffffffffffffff,1);
  _Var1 = roaring64_bitmap_contains(prVar2,0xffffffffffffffff);
  _assert_true((ulong)!_Var1,"roaring64_bitmap_contains(r, UINT64_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
               ,0xd6);
  uVar3 = roaring64_bitmap_minimum(prVar2);
  _assert_int_equal(uVar3,0xfffffffffffffffa,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0xd7);
  uVar3 = roaring64_bitmap_maximum(prVar2);
  _assert_int_equal(uVar3,0xfffffffffffffffe,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0xd8);
  uVar3 = roaring64_bitmap_get_cardinality(prVar2);
  _assert_int_equal(uVar3,5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0xd9);
  roaring64_bitmap_free(prVar2);
  return;
}

Assistant:

DEFINE_TEST(test_from_range) {
    {
        // Step greater than 2 ^ 16.
        roaring64_bitmap_t* r = roaring64_bitmap_from_range(0, 1000000, 200000);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, 0));
        assert_true(roaring64_bitmap_contains(r, 200000));
        assert_true(roaring64_bitmap_contains(r, 400000));
        assert_true(roaring64_bitmap_contains(r, 600000));
        assert_true(roaring64_bitmap_contains(r, 800000));
        assert_false(roaring64_bitmap_contains(r, 1000000));
        roaring64_bitmap_free(r);
    }
    {
        // Step less than 2 ^ 16 and within one container.
        roaring64_bitmap_t* r = roaring64_bitmap_from_range(0, 100, 20);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, 0));
        assert_true(roaring64_bitmap_contains(r, 20));
        assert_true(roaring64_bitmap_contains(r, 40));
        assert_true(roaring64_bitmap_contains(r, 60));
        assert_true(roaring64_bitmap_contains(r, 80));
        assert_false(roaring64_bitmap_contains(r, 100));
        roaring64_bitmap_free(r);
    }
    {
        // Step less than 2 ^ 16 and across two containers.
        roaring64_bitmap_t* r =
            roaring64_bitmap_from_range((1 << 16) - 1, (1 << 16) + 5, 2);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, (1 << 16) - 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 3));
        assert_false(roaring64_bitmap_contains(r, (1 << 16) + 5));
        roaring64_bitmap_free(r);
    }
    {
        // Step less than 2 ^ 16 and across multiple containers.
        roaring64_bitmap_t* r =
            roaring64_bitmap_from_range((1 << 16) - 1, (1 << 17) + 2, 1);
        assert_r64_valid(r);
        assert_true(roaring64_bitmap_contains(r, (1 << 16) - 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 0));
        assert_true(roaring64_bitmap_contains(r, (1 << 16) + 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 17) - 1));
        assert_true(roaring64_bitmap_contains(r, (1 << 17) + 0));
        assert_true(roaring64_bitmap_contains(r, (1 << 17) + 1));
        assert_false(roaring64_bitmap_contains(r, (1 << 17) + 2));
        roaring64_bitmap_free(r);
    }
    {
        // Range extending into the max container
        roaring64_bitmap_t* r = roaring64_bitmap_from_range(
            UINT64_MAX - 0x10000 - 10, UINT64_MAX - 0x10000 + 10, 2);
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 10);
        assert_int_equal(roaring64_bitmap_minimum(r),
                         UINT64_MAX - 0x10000 - 10);
        assert_int_equal(roaring64_bitmap_maximum(r), UINT64_MAX - 0x10000 + 8);
        roaring64_bitmap_free(r);
    }
    {
        // Range fully in the max container
        roaring64_bitmap_t* r =
            roaring64_bitmap_from_range(UINT64_MAX - 5, UINT64_MAX, 1);
        // From range is exclusive, so UINT64_MAX is not included
        assert_false(roaring64_bitmap_contains(r, UINT64_MAX));
        assert_int_equal(roaring64_bitmap_minimum(r), UINT64_MAX - 5);
        assert_int_equal(roaring64_bitmap_maximum(r), UINT64_MAX - 1);
        assert_int_equal(roaring64_bitmap_get_cardinality(r), 5);
        roaring64_bitmap_free(r);
    }
}